

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_ungrouped_aggregate.cpp
# Opt level: O3

SinkFinalizeType __thiscall
duckdb::PhysicalUngroupedAggregate::FinalizeDistinct
          (PhysicalUngroupedAggregate *this,Pipeline *pipeline,Event *event,ClientContext *context,
          GlobalSinkState *gstate_p)

{
  type pDVar1;
  pointer pDVar2;
  reference this_00;
  reference this_01;
  type gstate_p_00;
  pointer this_02;
  unique_ptr<duckdb::DistinctAggregateData,_std::default_delete<duckdb::DistinctAggregateData>,_true>
  *this_03;
  size_type __n;
  shared_ptr<duckdb::UngroupedDistinctAggregateFinalizeEvent,_true> new_event;
  undefined1 local_89;
  shared_ptr<duckdb::UngroupedDistinctAggregateFinalizeEvent,_true> local_88;
  Pipeline *local_78;
  PhysicalUngroupedAggregate *local_70;
  UngroupedAggregateGlobalSinkState *local_68;
  Event *local_60;
  shared_ptr<duckdb::Event,_true> local_58;
  shared_ptr<duckdb::UngroupedDistinctAggregateFinalizeEvent> local_40;
  
  local_78 = pipeline;
  local_68 = (UngroupedAggregateGlobalSinkState *)gstate_p;
  local_60 = event;
  pDVar1 = unique_ptr<duckdb::DistinctAggregateState,_std::default_delete<duckdb::DistinctAggregateState>,_true>
           ::operator*((unique_ptr<duckdb::DistinctAggregateState,_std::default_delete<duckdb::DistinctAggregateState>,_true>
                        *)&gstate_p[3].super_StateWithBlockableTasks.blocked_tasks.
                           super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>
                           .
                           super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
  this_03 = &this->distinct_data;
  local_70 = this;
  pDVar2 = unique_ptr<duckdb::DistinctAggregateData,_std::default_delete<duckdb::DistinctAggregateData>,_true>
           ::operator->(this_03);
  if ((pDVar2->radix_tables).
      super_vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (pDVar2->radix_tables).
      super_vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      pDVar2 = unique_ptr<duckdb::DistinctAggregateData,_std::default_delete<duckdb::DistinctAggregateData>,_true>
               ::operator->(this_03);
      this_00 = vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_true>
                ::operator[](&pDVar2->radix_tables,__n);
      this_01 = vector<duckdb::unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>,_true>
                ::operator[](&pDVar1->radix_states,__n);
      gstate_p_00 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
                    ::operator*(this_01);
      this_02 = unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>
                ::operator->(this_00);
      RadixPartitionedHashTable::Finalize(this_02,context,gstate_p_00);
      __n = __n + 1;
      pDVar2 = unique_ptr<duckdb::DistinctAggregateData,_std::default_delete<duckdb::DistinctAggregateData>,_true>
               ::operator->(this_03);
    } while (__n < (ulong)((long)(pDVar2->radix_tables).
                                 super_vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>_>_>
                                 .
                                 super__Vector_base<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pDVar2->radix_tables).
                                 super_vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>_>_>
                                 .
                                 super__Vector_base<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  local_40.
  super___shared_ptr<duckdb::UngroupedDistinctAggregateFinalizeEvent,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::UngroupedDistinctAggregateFinalizeEvent,std::allocator<duckdb::UngroupedDistinctAggregateFinalizeEvent>,duckdb::ClientContext&,duckdb::PhysicalUngroupedAggregate_const&,duckdb::UngroupedAggregateGlobalSinkState&,duckdb::Pipeline&>
            (&local_40.
              super___shared_ptr<duckdb::UngroupedDistinctAggregateFinalizeEvent,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,(UngroupedDistinctAggregateFinalizeEvent **)&local_40,
             (allocator<duckdb::UngroupedDistinctAggregateFinalizeEvent> *)&local_89,context,
             local_70,local_68,local_78);
  shared_ptr<duckdb::UngroupedDistinctAggregateFinalizeEvent,_true>::shared_ptr(&local_88,&local_40)
  ;
  if (local_40.
      super___shared_ptr<duckdb::UngroupedDistinctAggregateFinalizeEvent,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.
               super___shared_ptr<duckdb::UngroupedDistinctAggregateFinalizeEvent,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_58.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_88.internal.
       super___shared_ptr<duckdb::UngroupedDistinctAggregateFinalizeEvent,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr;
  local_58.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = local_88.internal.
         super___shared_ptr<duckdb::UngroupedDistinctAggregateFinalizeEvent,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
  local_88.internal.
  super___shared_ptr<duckdb::UngroupedDistinctAggregateFinalizeEvent,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  local_88.internal.
  super___shared_ptr<duckdb::UngroupedDistinctAggregateFinalizeEvent,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Event::InsertEvent(local_60,&local_58);
  if (local_58.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_88.internal.
      super___shared_ptr<duckdb::UngroupedDistinctAggregateFinalizeEvent,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.internal.
               super___shared_ptr<duckdb::UngroupedDistinctAggregateFinalizeEvent,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return READY;
}

Assistant:

SinkFinalizeType PhysicalUngroupedAggregate::FinalizeDistinct(Pipeline &pipeline, Event &event, ClientContext &context,
                                                              GlobalSinkState &gstate_p) const {
	auto &gstate = gstate_p.Cast<UngroupedAggregateGlobalSinkState>();
	D_ASSERT(distinct_data);
	auto &distinct_state = *gstate.distinct_state;

	for (idx_t table_idx = 0; table_idx < distinct_data->radix_tables.size(); table_idx++) {
		auto &radix_table_p = distinct_data->radix_tables[table_idx];
		auto &radix_state = *distinct_state.radix_states[table_idx];
		radix_table_p->Finalize(context, radix_state);
	}
	auto new_event = make_shared_ptr<UngroupedDistinctAggregateFinalizeEvent>(context, *this, gstate, pipeline);
	event.InsertEvent(std::move(new_event));
	return SinkFinalizeType::READY;
}